

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

void __thiscall
cmsys::CommandLineArguments::DeleteRemainingArguments
          (CommandLineArguments *this,int argc,char ***argv)

{
  int local_24;
  int cc;
  char ***argv_local;
  int argc_local;
  CommandLineArguments *this_local;
  
  for (local_24 = 0; local_24 < argc; local_24 = local_24 + 1) {
    if ((*argv)[local_24] != (char *)0x0) {
      operator_delete__((*argv)[local_24]);
    }
  }
  if (*argv != (char **)0x0) {
    operator_delete__(*argv);
  }
  return;
}

Assistant:

void CommandLineArguments::DeleteRemainingArguments(int argc, char*** argv)
{
  int cc;
  for ( cc = 0; cc < argc; ++ cc )
    {
    delete [] (*argv)[cc];
    }
  delete [] *argv;
}